

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

size_t secp256k1_pippenger_max_points(secp256k1_callback *error_callback,secp256k1_scratch *scratch)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t entry_size;
  size_t space_overhead;
  size_t space_for_points;
  size_t max_points;
  size_t n_points;
  size_t res;
  int bucket_window;
  size_t max_alloc;
  size_t in_stack_ffffffffffffffa8;
  secp256k1_scratch *in_stack_ffffffffffffffb0;
  secp256k1_callback *in_stack_ffffffffffffffb8;
  ulong local_28;
  int local_1c;
  
  sVar1 = secp256k1_scratch_max_allocation
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_28 = 0;
  local_1c = 1;
  while( true ) {
    if (0xc < local_1c) {
      return local_28;
    }
    sVar2 = secp256k1_pippenger_bucket_window_inv(local_1c);
    uVar3 = ((long)((local_1c + 0x80) / (local_1c + 1) + 1) * 4 + 0x88) * 2;
    uVar4 = (0x80L << ((byte)local_1c & 0x3f)) + uVar3 + 0x10;
    if (sVar1 < uVar4) break;
    sVar5 = (sVar1 - uVar4) / uVar3;
    if (sVar2 < sVar5) {
      sVar5 = sVar2;
    }
    if (local_28 < sVar5) {
      local_28 = sVar5;
    }
    if (sVar5 < sVar2) {
      return local_28;
    }
    local_1c = local_1c + 1;
  }
  return local_28;
}

Assistant:

static size_t secp256k1_pippenger_max_points(const secp256k1_callback* error_callback, secp256k1_scratch *scratch) {
    size_t max_alloc = secp256k1_scratch_max_allocation(error_callback, scratch, PIPPENGER_SCRATCH_OBJECTS);
    int bucket_window;
    size_t res = 0;

    for (bucket_window = 1; bucket_window <= PIPPENGER_MAX_BUCKET_WINDOW; bucket_window++) {
        size_t n_points;
        size_t max_points = secp256k1_pippenger_bucket_window_inv(bucket_window);
        size_t space_for_points;
        size_t space_overhead;
        size_t entry_size = sizeof(secp256k1_ge) + sizeof(secp256k1_scalar) + sizeof(struct secp256k1_pippenger_point_state) + (WNAF_SIZE(bucket_window+1)+1)*sizeof(int);

        entry_size = 2*entry_size;
        space_overhead = (sizeof(secp256k1_gej) << bucket_window) + entry_size + sizeof(struct secp256k1_pippenger_state);
        if (space_overhead > max_alloc) {
            break;
        }
        space_for_points = max_alloc - space_overhead;

        n_points = space_for_points/entry_size;
        n_points = n_points > max_points ? max_points : n_points;
        if (n_points > res) {
            res = n_points;
        }
        if (n_points < max_points) {
            /* A larger bucket_window may support even more points. But if we
             * would choose that then the caller couldn't safely use any number
             * smaller than what this function returns */
            break;
        }
    }
    return res;
}